

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O3

const_iterator __thiscall
QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
::find(QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
       *this,QAbstractButton **key)

{
  long lVar1;
  bool bVar2;
  const_iterator cVar3;
  
  cVar3 = lower_bound(this,key);
  cVar3.i = cVar3.i;
  cVar3.c = cVar3.c;
  lVar1 = (this->c).keys.super_QVLABase<QAbstractButton_*>.super_QVLABaseBase.s;
  if (cVar3.i != lVar1 || cVar3.c != &this->c) {
    bVar2 = *key < *(QAbstractButton **)
                    ((long)(((containers *)&(cVar3.c)->keys)->keys).
                           super_QVLABase<QAbstractButton_*>.super_QVLABaseBase.ptr + cVar3.i * 8);
    if (bVar2) {
      cVar3.c = &this->c;
    }
    cVar3.i = cVar3.i;
    cVar3.c = cVar3.c;
    if (bVar2) {
      cVar3.i = lVar1;
    }
  }
  return cVar3;
}

Assistant:

const_iterator find(const Key &key) const
    {
        auto it = lower_bound(key);
        if (it != end()) {
            if (!key_compare::operator()(key, it.key()))
                return it;
            it = end();
        }
        return it;
    }